

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O3

int Imf_2_5::getScanlineChunkOffsetTableSize(Header *header)

{
  Box2i *pBVar1;
  Compression *pCVar2;
  ArgExc *this;
  
  pBVar1 = Header::dataWindow(header);
  pCVar2 = Header::compression(header);
  if ((ulong)*pCVar2 < 10) {
    return (((pBVar1->max).y + *(int *)(&DAT_02fab6c8 + (ulong)*pCVar2 * 4)) - (pBVar1->min).y) /
           *(int *)(&DAT_02fab6c8 + (ulong)*pCVar2 * 4);
  }
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this,"Unknown compression type");
  __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

int
getScanlineChunkOffsetTableSize(const Header& header)
{
    const Box2i &dataWindow = header.dataWindow();

    int linesInBuffer = numLinesInBuffer ( header.compression() );

    int lineOffsetSize = (dataWindow.max.y - dataWindow.min.y +
                          linesInBuffer) / linesInBuffer;

    return lineOffsetSize;
}